

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_or_many_heap(uint32_t number,roaring_bitmap_t **x)

{
  uint8_t uVar1;
  uint8_t type2;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  roaring_pq_element_t *prVar5;
  void *pvVar6;
  bitset_container_t *c1;
  bitset_container_t *bitset;
  _Bool _Var7;
  undefined7 uVar8;
  roaring_bitmap_t *ra;
  ushort uVar9;
  roaring_bitmap_t *prVar10;
  roaring_pq_t *prVar11;
  roaring_pq_element_t *prVar12;
  size_t sVar13;
  roaring_array_t *prVar14;
  shared_container_t *psVar15;
  bitset_container_t *pbVar16;
  ushort *puVar17;
  uint end_index;
  void **ppvVar18;
  ulong uVar19;
  roaring_bitmap_t **pprVar20;
  roaring_array_t *prVar21;
  uint64_t uVar22;
  ulong uVar23;
  uint32_t i;
  uint uVar24;
  uint start_index;
  bool bVar25;
  roaring_pq_element_t newelement;
  roaring_pq_element_t x2;
  roaring_pq_element_t x1;
  uint local_c4;
  roaring_pq_element_t local_98;
  roaring_pq_t *local_80;
  roaring_pq_element_t local_78;
  roaring_pq_element_t local_58;
  void *local_38;
  
  if (number == 1) {
    prVar10 = roaring_bitmap_copy(*x);
    return prVar10;
  }
  if (number == 0) {
    prVar10 = roaring_bitmap_create_with_capacity(0);
    return prVar10;
  }
  prVar11 = (roaring_pq_t *)malloc(0x10);
  uVar19 = (ulong)number;
  prVar12 = (roaring_pq_element_t *)malloc(uVar19 * 0x18);
  prVar11->elements = prVar12;
  prVar11->size = uVar19;
  pprVar20 = &prVar12->bitmap;
  uVar23 = 0;
  local_80 = prVar11;
  do {
    prVar14 = &x[uVar23]->high_low_container;
    *pprVar20 = (roaring_bitmap_t *)prVar14;
    *(_Bool *)(pprVar20 + -1) = false;
    sVar13 = ra_portable_size_in_bytes(prVar14);
    prVar11 = local_80;
    ((roaring_pq_element_t *)(pprVar20 + -2))->size = sVar13;
    uVar23 = uVar23 + 1;
    pprVar20 = pprVar20 + 3;
  } while (uVar19 != uVar23);
  i = number >> 1;
  do {
    percolate_down(prVar11,i);
    bVar25 = i != 0;
    i = i - 1;
  } while (bVar25);
  if (1 < number) {
LAB_0011da41:
    prVar5 = prVar11->elements;
    local_58.bitmap = prVar5->bitmap;
    local_58.size = prVar5->size;
    local_58.is_temporary = prVar5->is_temporary;
    local_58._9_7_ = *(undefined7 *)&prVar5->field_0x9;
    uVar23 = uVar19 - 1;
    prVar11->size = uVar23;
    prVar5->bitmap = prVar5[uVar23].bitmap;
    prVar12 = prVar5 + uVar23;
    _Var7 = prVar12->is_temporary;
    uVar8 = *(undefined7 *)&prVar12->field_0x9;
    prVar5->size = prVar12->size;
    prVar5->is_temporary = _Var7;
    *(undefined7 *)&prVar5->field_0x9 = uVar8;
    percolate_down(prVar11,0);
    local_78.bitmap = prVar5->bitmap;
    local_78.size = prVar5->size;
    local_78.is_temporary = prVar5->is_temporary;
    local_78._9_7_ = *(undefined7 *)&prVar5->field_0x9;
    uVar22 = uVar19 - 2;
    prVar11->size = uVar22;
    if (1 < uVar23) {
      prVar5->bitmap = prVar5[uVar22].bitmap;
      prVar12 = prVar5 + uVar22;
      _Var7 = prVar12->is_temporary;
      uVar8 = *(undefined7 *)&prVar12->field_0x9;
      prVar5->size = prVar12->size;
      prVar5->is_temporary = _Var7;
      *(undefined7 *)&prVar5->field_0x9 = uVar8;
      percolate_down(prVar11,0);
    }
    ra = local_58.bitmap;
    prVar10 = local_78.bitmap;
    if (local_58.is_temporary != true) {
      if (local_78.is_temporary != false) {
        roaring_bitmap_lazy_or_inplace(local_78.bitmap,local_58.bitmap,false);
        local_78.size = ra_portable_size_in_bytes(&prVar10->high_low_container);
        prVar12 = &local_78;
        goto LAB_0011df99;
      }
      prVar14 = &roaring_bitmap_lazy_or(local_58.bitmap,local_78.bitmap,false)->high_low_container;
      local_98.size = ra_portable_size_in_bytes(prVar14);
      local_98.is_temporary = true;
      local_98.bitmap = (roaring_bitmap_t *)prVar14;
      goto LAB_0011df91;
    }
    if (local_78.is_temporary != false) {
      local_98.size = local_98.size & 0xffffffffffffff00;
      uVar3 = *(uint *)&(local_58.bitmap)->high_low_container;
      if (uVar3 == 0) {
        roaring_bitmap_free(local_58.bitmap);
        prVar14 = &prVar10->high_low_container;
      }
      else {
        end_index = *(uint *)&(local_78.bitmap)->high_low_container;
        if (end_index != 0) {
          uVar24 = end_index;
          if ((int)uVar3 < (int)end_index) {
            uVar24 = uVar3;
          }
          prVar14 = &roaring_bitmap_create_with_capacity(uVar24)->high_low_container;
          puVar17 = *(uint16_t **)((long)ra + 0x10);
          uVar9 = **(uint16_t **)((long)prVar10 + 0x10);
          local_c4 = 0;
          uVar24 = 0;
LAB_0011db40:
          do {
            uVar2 = *puVar17;
            start_index = uVar24;
            while( true ) {
              uVar24 = start_index + 1;
              prVar21 = &prVar10->high_low_container;
              if (uVar2 == uVar9) break;
              if (uVar2 < uVar9) {
                uVar1 = (*(uint8_t **)((long)ra + 0x18))[local_c4 & 0xffff];
                local_38 = (*(void ***)((long)ra + 8))[local_c4 & 0xffff];
                extend_array(prVar14,1);
                iVar4 = prVar14->size;
                prVar14->keys[iVar4] = uVar2;
                prVar14->containers[iVar4] = local_38;
                prVar14->typecodes[iVar4] = uVar1;
                prVar14->size = prVar14->size + 1;
                local_c4 = local_c4 + 1;
                if (local_c4 == uVar3) goto LAB_0011df27;
                puVar17 = (ushort *)
                          ((ulong)((local_c4 & 0xffff) * 2) + (long)*(uint16_t **)((long)ra + 0x10))
                ;
                uVar24 = start_index;
                goto LAB_0011db40;
              }
              uVar1 = (*(uint8_t **)((long)prVar10 + 0x18))[(ulong)start_index & 0xffff];
              pvVar6 = (*(void ***)((long)prVar10 + 8))[(ulong)start_index & 0xffff];
              extend_array(prVar14,1);
              iVar4 = prVar14->size;
              prVar14->keys[iVar4] = uVar9;
              prVar14->containers[iVar4] = pvVar6;
              prVar14->typecodes[iVar4] = uVar1;
              prVar14->size = prVar14->size + 1;
              start_index = end_index;
              if (end_index == uVar24) goto LAB_0011deee;
              uVar9 = (*(uint16_t **)((long)prVar10 + 0x10))[uVar24 & 0xffff];
              start_index = uVar24;
            }
            uVar19 = (ulong)(ushort)local_c4;
            if ((ra->high_low_container).size <= (int)(local_c4 & 0xffff)) {
LAB_0011dfff:
              __assert_fail("i < ra->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x1a95,
                            "void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
            }
            ppvVar18 = *(void ***)((long)ra + 8);
            psVar15 = (shared_container_t *)ppvVar18[uVar19];
            if ((*(uint8_t **)((long)ra + 0x18))[uVar19] == '\x04') {
              psVar15 = (shared_container_t *)
                        shared_container_extract_copy
                                  (psVar15,*(uint8_t **)((long)ra + 0x18) + uVar19);
              ppvVar18 = *(void ***)((long)ra + 8);
            }
            uVar23 = (ulong)((local_c4 & 0xffff) * 8);
            *(shared_container_t **)((long)ppvVar18 + uVar23) = psVar15;
            uVar1 = (*(uint8_t **)((long)ra + 0x18))[uVar19];
            if (uVar1 == '\x04') {
              __assert_fail("type1 != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x4a24,
                            "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                           );
            }
            uVar9 = (ushort)start_index;
            if ((prVar10->high_low_container).size <= (int)(start_index & 0xffff))
            goto LAB_0011dfff;
            c1 = *(bitset_container_t **)((long)*(void ***)((long)ra + 8) + uVar23);
            ppvVar18 = *(void ***)((long)prVar10 + 8);
            psVar15 = (shared_container_t *)ppvVar18[uVar9];
            if ((*(uint8_t **)((long)prVar10 + 0x18))[uVar9] == '\x04') {
              psVar15 = (shared_container_t *)
                        shared_container_extract_copy
                                  (psVar15,*(uint8_t **)((long)prVar10 + 0x18) + uVar9);
              ppvVar18 = *(void ***)((long)prVar10 + 8);
            }
            uVar19 = (ulong)((start_index & 0xffff) * 8);
            *(shared_container_t **)((long)ppvVar18 + uVar19) = psVar15;
            type2 = (*(uint8_t **)((long)prVar10 + 0x18))[uVar9];
            if (type2 == '\x04') {
              __assert_fail("type2 != SHARED_CONTAINER_TYPE",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                            ,0x4a29,
                            "roaring_bitmap_t *lazy_or_from_lazy_inputs(roaring_bitmap_t *, roaring_bitmap_t *)"
                           );
            }
            bitset = *(bitset_container_t **)((long)*(void ***)((long)prVar10 + 8) + uVar19);
            if ((uVar1 == '\x01') || (type2 != '\x01')) {
              pbVar16 = (bitset_container_t *)
                        container_lazy_ior(c1,uVar1,bitset,type2,(uint8_t *)&local_98);
              container_free(bitset,type2);
              if (pbVar16 != c1) {
                container_free(c1,uVar1);
              }
            }
            else {
              pbVar16 = (bitset_container_t *)
                        container_lazy_ior(bitset,'\x01',c1,uVar1,(uint8_t *)&local_98);
              container_free(c1,uVar1);
              if (pbVar16 != bitset) {
                bitset_container_free(bitset);
              }
            }
            uVar1 = (uint8_t)local_98.size;
            extend_array(prVar14,1);
            iVar4 = prVar14->size;
            prVar14->keys[iVar4] = uVar2;
            prVar14->containers[iVar4] = pbVar16;
            prVar14->typecodes[iVar4] = uVar1;
            prVar14->size = prVar14->size + 1;
            local_c4 = local_c4 + 1;
            start_index = uVar24;
            if ((local_c4 == uVar3) || (end_index == uVar24)) goto LAB_0011deee;
            puVar17 = (ushort *)
                      ((ulong)((local_c4 & 0xffff) * 2) + (long)*(uint16_t **)((long)ra + 0x10));
            uVar9 = (*(uint16_t **)((long)prVar10 + 0x10))[uVar24 & 0xffff];
          } while( true );
        }
        roaring_bitmap_free(local_78.bitmap);
        prVar14 = &ra->high_low_container;
      }
      goto LAB_0011df6c;
    }
    roaring_bitmap_lazy_or_inplace(local_58.bitmap,local_78.bitmap,false);
    local_58.size = ra_portable_size_in_bytes(&ra->high_low_container);
    prVar12 = &local_58;
    goto LAB_0011df99;
  }
LAB_0011dfce:
  prVar10 = prVar12->bitmap;
  roaring_bitmap_repair_after_lazy(prVar10);
  free(prVar12);
  free(prVar11);
  return prVar10;
LAB_0011deee:
  if ((local_c4 == uVar3) ||
     (bVar25 = start_index == end_index, prVar21 = &ra->high_low_container, start_index = local_c4,
     end_index = uVar3, bVar25)) {
LAB_0011df27:
    ra_append_move_range(prVar14,prVar21,start_index,end_index);
  }
  free(*(void ***)((long)ra + 8));
  *(uint16_t **)((long)ra + 0x10) = (uint16_t *)0x0;
  *(uint8_t **)((long)ra + 0x18) = (uint8_t *)0x0;
  *(undefined8 *)ra = 0;
  *(void ***)((long)ra + 8) = (void **)0x0;
  free(*(void ***)((long)prVar10 + 8));
  *(uint16_t **)((long)prVar10 + 0x10) = (uint16_t *)0x0;
  *(uint8_t **)((long)prVar10 + 0x18) = (uint8_t *)0x0;
  *(undefined8 *)prVar10 = 0;
  *(void ***)((long)prVar10 + 8) = (void **)0x0;
  free(ra);
  free(prVar10);
LAB_0011df6c:
  local_98.size = ra_portable_size_in_bytes(prVar14);
  local_98.is_temporary =
       &prVar10->high_low_container != prVar14 || &ra->high_low_container != prVar14;
  prVar11 = local_80;
  local_98.bitmap = (roaring_bitmap_t *)prVar14;
LAB_0011df91:
  prVar12 = &local_98;
LAB_0011df99:
  pq_add(prVar11,prVar12);
  uVar19 = prVar11->size;
  if (uVar19 < 2) goto LAB_0011dfca;
  goto LAB_0011da41;
LAB_0011dfca:
  prVar12 = prVar11->elements;
  goto LAB_0011dfce;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_or_many_heap(uint32_t number,
                                              const roaring_bitmap_t **x) {
    if (number == 0) {
        return roaring_bitmap_create();
    }
    if (number == 1) {
        return roaring_bitmap_copy(x[0]);
    }
    roaring_pq_t *pq = create_pq(x, number);
    while (pq->size > 1) {
        roaring_pq_element_t x1 = pq_poll(pq);
        roaring_pq_element_t x2 = pq_poll(pq);

        if (x1.is_temporary && x2.is_temporary) {
            roaring_bitmap_t *newb =
                lazy_or_from_lazy_inputs(x1.bitmap, x2.bitmap);
            // should normally return a fresh new bitmap *except* that
            // it can return x1.bitmap or x2.bitmap in degenerate cases
            bool temporary = !((newb == x1.bitmap) && (newb == x2.bitmap));
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = temporary, .bitmap = newb};
            pq_add(pq, &newelement);
        } else if (x2.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x2.bitmap, x1.bitmap, false);
            x2.size = roaring_bitmap_portable_size_in_bytes(x2.bitmap);
            pq_add(pq, &x2);
        } else if (x1.is_temporary) {
            roaring_bitmap_lazy_or_inplace(x1.bitmap, x2.bitmap, false);
            x1.size = roaring_bitmap_portable_size_in_bytes(x1.bitmap);

            pq_add(pq, &x1);
        } else {
            roaring_bitmap_t *newb =
                roaring_bitmap_lazy_or(x1.bitmap, x2.bitmap, false);
            uint64_t bsize = roaring_bitmap_portable_size_in_bytes(newb);
            roaring_pq_element_t newelement = {
                .size = bsize, .is_temporary = true, .bitmap = newb};

            pq_add(pq, &newelement);
        }
    }
    roaring_pq_element_t X = pq_poll(pq);
    roaring_bitmap_t *answer = X.bitmap;
    roaring_bitmap_repair_after_lazy(answer);
    pq_free(pq);
    return answer;
}